

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.hpp
# Opt level: O3

void __thiscall
Shell::Options::ChoiceOptionValue<Shell::Options::Intent>::output
          (ChoiceOptionValue<Shell::Options::Intent> *this,ostream *out,bool linewrap)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  undefined1 in_DL;
  ostream *in_RSI;
  int i;
  int count;
  uint j;
  string next;
  string values_header;
  undefined4 in_stack_ffffffffffffff28;
  undefined3 in_stack_ffffffffffffff2c;
  uint i_00;
  uint in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar5;
  int iVar6;
  AbstractOptionValue *in_stack_ffffffffffffff38;
  int local_b4;
  uint local_b0;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  i_00 = CONCAT13(in_DL,in_stack_ffffffffffffff2c) & 0x1ffffff;
  AbstractOptionValue::output
            (in_stack_ffffffffffffff38,
             (ostream *)
             (CONCAT44(CONCAT13(in_DL,in_stack_ffffffffffffff2c),in_stack_ffffffffffffff28) &
             0x1ffffffffffffff),false);
  poVar2 = std::operator<<(in_RSI,"\tdefault: ");
  OptionChoiceValues::operator[][abi_cxx11_
            ((OptionChoiceValues *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             i_00);
  std::operator<<(poVar2,local_40);
  std::__cxx11::string::~string(local_40);
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"values: ",(allocator<char> *)&stack0xffffffffffffff2e);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2e);
  poVar2 = std::operator<<(in_RSI,"\t");
  std::operator<<(poVar2,local_80);
  local_b4 = 0;
  iVar5 = 0;
  while( true ) {
    iVar6 = iVar5;
    iVar1 = OptionChoiceValues::length((OptionChoiceValues *)0x264f36);
    if (iVar1 <= iVar5) break;
    if (iVar6 == 0) {
      OptionChoiceValues::operator[][abi_cxx11_
                ((OptionChoiceValues *)(ulong)in_stack_ffffffffffffff30,i_00);
      std::operator<<(in_RSI,local_60);
      std::__cxx11::string::~string(local_60);
    }
    else {
      std::operator<<(in_RSI,",");
      OptionChoiceValues::operator[][abi_cxx11_
                ((OptionChoiceValues *)CONCAT44(iVar6,in_stack_ffffffffffffff30),i_00);
      if ((i_00 & 0x1000000) != 0) {
        lVar3 = std::__cxx11::string::size();
        if (0x3c < (ulong)(lVar3 + local_b4)) {
          poVar2 = (ostream *)
                   std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
          std::operator<<(poVar2,"\t");
          local_b0 = 0;
          while( true ) {
            uVar4 = std::__cxx11::string::size();
            if (uVar4 <= local_b0) break;
            std::operator<<(in_RSI," ");
            local_b0 = local_b0 + 1;
          }
          local_b4 = 0;
        }
      }
      std::operator<<(in_RSI,local_a0);
      iVar5 = std::__cxx11::string::size();
      local_b4 = local_b4 + iVar5;
      std::__cxx11::string::~string(local_a0);
    }
    iVar5 = iVar6 + 1;
  }
  std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

virtual void output(std::ostream& out,bool linewrap) const {
            AbstractOptionValue::output(out,linewrap);
            out << "\tdefault: " << choices[static_cast<unsigned>(this->defaultValue)];
            out << std::endl;
            std::string values_header = "values: ";
            out << "\t" << values_header;
            // Again we restrict line length to 70 characters
            int count=0;
            for(int i=0;i<choices.length();i++){
                if(i==0){
                    out << choices[i];
                }
                else{
                    out << ",";
                    std::string next = choices[i];
                    if(linewrap && next.size()+count>60){ // next.size() will be <70, how big is a tab?
                        out << std::endl << "\t";
                        for(unsigned j=0;j<values_header.size();j++){out << " ";}
                        count = 0;
                    }
                    out << next;
                    count += next.size();
                }
            }
            out << std::endl;
        }